

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void doctest::detail::registerReporterImpl
               (char *name,int priority,reporterCreatorFunc c,bool isReporter)

{
  size_t sVar1;
  undefined3 in_register_00000009;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  local_68;
  int local_40;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  local_68.second = c;
  local_40 = priority;
  if (CONCAT31(in_register_00000009,isReporter) == 0) {
    anon_unknown_14::getListeners();
    sVar1 = strlen(name);
    String::String((String *)&local_38.data,name,(uint)sVar1);
    local_68.first.first = local_40;
    local_68.first.second.field_0.data.ptr = (char *)CONCAT71(local_38._1_7_,local_38.buf[0]);
    local_68.first.second.field_0._8_8_ = local_38._8_8_;
    local_68.first.second.field_0.buf[0x17] = local_38.buf[0x17];
    local_38.buf[0] = '\0';
    local_38.buf[0x17] = '\x17';
    std::
    _Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
    ::
    _M_insert_unique<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>
              ((_Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
                *)&anon_unknown_14::getListeners::data,&local_68);
  }
  else {
    anon_unknown_14::getReporters();
    sVar1 = strlen(name);
    String::String((String *)&local_38.data,name,(uint)sVar1);
    local_68.first.first = local_40;
    local_68.first.second.field_0.data.ptr = (char *)CONCAT71(local_38._1_7_,local_38.buf[0]);
    local_68.first.second.field_0._8_8_ = local_38._8_8_;
    local_68.first.second.field_0.buf[0x17] = local_38.buf[0x17];
    local_38.buf[0] = '\0';
    local_38.buf[0x17] = '\x17';
    std::
    _Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
    ::
    _M_insert_unique<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>
              ((_Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
                *)&anon_unknown_14::getReporters::data,&local_68);
  }
  if ((local_68.first.second.field_0.buf[0x17] < '\0') &&
     (local_68.first.second.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_68.first.second.field_0.data.ptr);
  }
  return;
}

Assistant:

void registerReporterImpl(const char* name, int priority, reporterCreatorFunc c, bool isReporter) {
        if(isReporter)
            getReporters().insert(reporterMap::value_type(reporterMap::key_type(priority, name), c));
        else
            getListeners().insert(reporterMap::value_type(reporterMap::key_type(priority, name), c));
    }